

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::ipc::Deferred<perfetto::protos::gen::EnableTracingResponse>::Deferred
          (Deferred<perfetto::protos::gen::EnableTracingResponse> *this,
          function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::EnableTracingResponse>)>
          *callback)

{
  _Manager_type p_Var1;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  *(undefined8 *)&(this->super_DeferredBase).callback_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_DeferredBase).callback_.super__Function_base._M_functor + 8) =
       0;
  (this->super_DeferredBase).callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_DeferredBase).callback_._M_invoker = (_Invoker_type)0x0;
  uStack_20 = 0;
  local_28 = 0;
  uStack_30 = 0;
  local_38 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  Bind(this,(function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::EnableTracingResponse>)>
             *)&local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  return;
}

Assistant:

explicit Deferred(std::function<void(AsyncResult<T>)> callback = nullptr) {
    Bind(std::move(callback));
  }